

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.cpp
# Opt level: O2

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::ParserDPOMDPFormat_Spirit
          (ParserDPOMDPFormat_Spirit *this,DecPOMDPDiscrete *problem)

{
  undefined1 auVar1 [64];
  
  (this->super_ParserInterface)._vptr_ParserInterface =
       (_func_int **)&PTR__ParserDPOMDPFormat_Spirit_00604c80;
  this->_m_decPOMDPDiscrete = problem;
  (this->_m_lp_string)._M_dataplus._M_p = (pointer)&(this->_m_lp_string).field_2;
  (this->_m_lp_string)._M_string_length = 0;
  (this->_m_lp_string).field_2._M_local_buf[0] = '\0';
  (this->_m_curMatrix).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_curMatrix).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_curMatrix).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_curIdentList).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_curIdentList).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auVar1 = ZEXT464(0) << 0x40;
  (this->_m_curIdentList).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [64])
   &(this->_m_lp_JAI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = auVar1;
  this->_m_lp_JA = (vector<unsigned_int,_std::allocator<unsigned_int>_>)auVar1._0_24_;
  this->_m_lp_JO = (vector<unsigned_int,_std::allocator<unsigned_int>_>)auVar1._24_24_;
  (this->_m_lp_JAI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar1._48_8_;
  (this->_m_lp_JAI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar1._56_8_;
  *(undefined1 (*) [64])
   &(this->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = auVar1;
  this->_m_matrixModified = true;
  this->_m_identListModified = false;
  this->_m_startStateListExclude = false;
  this->_m_nrA = 0;
  return;
}

Assistant:

ParserDPOMDPFormat_Spirit::ParserDPOMDPFormat_Spirit(DecPOMDPDiscrete* problem) :
//    UNIFORMTOK(this),
    _m_decPOMDPDiscrete(problem)
{
    if(DEBUG_PARSE)
    {
        cout << "Creating parser, referring to problem...";
        cout << problem->MultiAgentDecisionProcess::SoftPrint();
        cout << endl;
    }
    //need to reset the parse matrix the first time...
    _m_matrixModified = true;
    _m_identListModified = false;
    _m_startStateListExclude = false;
    _m_nrA = 0;
 //   UNIFORMTOK = uniformtok(this);

}